

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O2

int __thiscall fw::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  int iVar1;
  ostream *poVar2;
  GLint success;
  GLchar infoLog [512];
  int local_21c;
  char local_218 [520];
  
  (*glad_glLinkProgram)(this->_program);
  iVar1 = (*glad_glGetProgramiv)(this->_program,0x8b82,&local_21c);
  if (local_21c == 0) {
    (*glad_glGetProgramInfoLog)(this->_program,0x200,(GLsizei *)0x0,local_218);
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Shader link");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,local_218);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = (int)poVar2;
  }
  return iVar1;
}

Assistant:

void ShaderProgram::link() {
  glLinkProgram(_program);

  GLint success;
  GLchar infoLog[512];
  glGetProgramiv(_program, GL_LINK_STATUS, &success);
  if (!success) {
      glGetProgramInfoLog(_program, 512, NULL, infoLog);
      std::cout << "Error: Shader link" << std::endl << infoLog << std::endl;
  }
}